

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

void __thiscall
bgui::ImageAdapter<float>::adaptMinMaxIntensity
          (ImageAdapter<float> *this,long x,long y,long w,long h)

{
  int iVar1;
  SMatrix<long,_2,_3> *a;
  double dVar2;
  double dVar3;
  int iVar4;
  Image<float,_gimage::PixelTraits<float>_> *pIVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long y_1;
  long x_1;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  SVector<long,_2> p1;
  SVector<long,_2> p2;
  
  a = &(this->super_ImageAdapterBase).R;
  gmath::SMatrix<long,_2,_3>::operator*((SMatrix<long,_2,_3> *)&p1,(SVector<long,_3> *)a);
  gmath::SMatrix<long,_2,_3>::operator*((SMatrix<long,_2,_3> *)&p2,(SVector<long,_3> *)a);
  lVar8 = p2.v[0];
  if (p2.v[0] < p1.v[0]) {
    lVar8 = p1.v[0];
    p1.v[0] = p2.v[0];
  }
  lVar9 = p2.v[1];
  if (p2.v[1] < p1.v[1]) {
    lVar9 = p1.v[1];
    p1.v[1] = p2.v[1];
  }
  lVar10 = 0;
  if (p1.v[0] < 1) {
    p1.v[0] = lVar10;
  }
  pIVar5 = this->image;
  lVar7 = pIVar5->width + -1;
  if (lVar8 <= lVar7) {
    lVar7 = lVar8;
  }
  if (p1.v[1] < 1) {
    p1.v[1] = lVar10;
  }
  lVar8 = pIVar5->height + -1;
  if (lVar9 <= lVar8) {
    lVar8 = lVar9;
  }
  dVar2 = this->vmax;
  (this->super_ImageAdapterBase).imin = dVar2;
  dVar3 = this->vmin;
  (this->super_ImageAdapterBase).imax = dVar3;
  iVar1 = pIVar5->depth + -1;
  iVar4 = (this->super_ImageAdapterBase).channel;
  iVar6 = iVar1;
  lVar9 = lVar10;
  if (iVar4 < pIVar5->depth) {
    iVar6 = iVar4;
    lVar9 = (long)iVar4;
  }
  if (iVar4 < 0) {
    lVar9 = lVar10;
    iVar6 = iVar1;
  }
  dVar12 = dVar3;
  dVar13 = dVar2;
  for (; lVar10 = p1.v[1], dVar14 = dVar13, lVar9 <= iVar6; lVar9 = lVar9 + 1) {
    for (; lVar11 = p1.v[0], lVar10 <= lVar8; lVar10 = lVar10 + 1) {
      for (; lVar11 <= lVar7; lVar11 = lVar11 + 1) {
        dVar15 = (double)pIVar5->img[lVar9][lVar10][lVar11];
        if ((dVar3 <= dVar15) && (dVar15 <= dVar2)) {
          dVar13 = dVar15;
          if (dVar14 <= dVar15) {
            dVar13 = dVar14;
          }
          (this->super_ImageAdapterBase).imin = dVar13;
          if (dVar15 <= dVar12) {
            dVar15 = dVar12;
          }
          dVar12 = dVar15;
          (this->super_ImageAdapterBase).imax = dVar12;
          dVar14 = dVar13;
        }
      }
    }
  }
  if (dVar12 <= dVar13) {
    (this->super_ImageAdapterBase).imin = 0.0;
    (this->super_ImageAdapterBase).imax = 1.0;
  }
  return;
}

Assistant:

void adaptMinMaxIntensity(long x, long y, long w, long h)
    {
      // compute original area

      const gmath::SVector<long, 2> p1=R*gmath::SVector<long, 3>(static_cast<long>(x/scale),
                                       static_cast<long>(y/scale), 1);
      const gmath::SVector<long, 2> p2=R*gmath::SVector<long, 3>(static_cast<long>((x+w-1)/scale),
                                       static_cast<long>((y+h-1)/scale), 1);

      long xmin=std::min(p1[0], p2[0]), xmax=std::max(p1[0], p2[0]);
      long ymin=std::min(p1[1], p2[1]), ymax=std::max(p1[1], p2[1]);

      xmin=std::max(xmin, 0l);
      xmax=std::min(xmax, image->getWidth()-1);
      ymin=std::max(ymin, 0l);
      ymax=std::min(ymax, image->getHeight()-1);

      // search minimum and maximum valid intensity in the specified area

      imin=vmax;
      imax=vmin;

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        for (long y=ymin; y<=ymax; y++)
        {
          for (long x=xmin; x<=xmax; x++)
          {
            double v=image->get(x, y, d);

            if (v >= vmin && v <= vmax)
            {
              imin=std::min(imin, v);
              imax=std::max(imax, v);
            }
          }
        }
      }

      if (imax <= imin)
      {
        imin=0;
        imax=1;
      }
    }